

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plist.cpp
# Opt level: O0

void __thiscall spatial_region::erase(spatial_region *this,plist *a)

{
  long *in_RSI;
  particle *tmp;
  particle *current;
  bool in_stack_00000057;
  particle *in_stack_00000058;
  spatial_region *in_stack_00000060;
  long local_18;
  
  local_18 = *in_RSI;
  while (local_18 != 0) {
    local_18 = *(long *)(local_18 + 0x58);
    delete_particle(in_stack_00000060,in_stack_00000058,in_stack_00000057);
  }
  *in_RSI = 0;
  in_RSI[1] = 0;
  return;
}

Assistant:

void spatial_region::erase(plist& a)
{
    particle* current;
    particle* tmp;
    current = a.head;
    while(current!=0)
    {
        tmp = current->next;
        delete_particle(current);
        current = tmp;
    }
    a.head = 0;
    a.start = 0;
}